

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_v2i(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  exr_attr_v2i_t tmp;
  int32_t isz;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 local_20;
  undefined4 local_14;
  
  local_20 = (((a->field_6).box2i)->min).field_0;
  local_14 = 8;
  eVar1 = (*ctxt->do_write)(ctxt,&local_14,4,&ctxt->output_file_offset);
  if (eVar1 == 0) {
    eVar1 = (*ctxt->do_write)(ctxt,&local_20,8,&ctxt->output_file_offset);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_v2i (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t   rv;
    exr_attr_v2i_t tmp = *(a->v2i);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_v2i_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 2);
    return rv;
}